

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O0

LineParameters
deqp::gls::theilSenLinearRegression
          (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *dataPoints)

{
  LineParameters LVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float local_84;
  int local_80;
  float local_7c;
  int i_1;
  Vec2 *ptB;
  const_reference pvStack_68;
  int j;
  Vec2 *ptA;
  int i;
  undefined1 local_50 [8];
  vector<float,_std::allocator<float>_> pointwiseOffsets;
  vector<float,_std::allocator<float>_> pairwiseCoefficients;
  int numDataPoints;
  float epsilon;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *dataPoints_local;
  LineParameters result;
  
  sVar3 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                    (dataPoints);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &pointwiseOffsets.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_50);
  LineParameters::LineParameters((LineParameters *)&dataPoints_local,0.0,0.0);
  for (ptA._0_4_ = 0; (int)ptA < (int)sVar3; ptA._0_4_ = (int)ptA + 1) {
    pvStack_68 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                 operator[](dataPoints,(long)(int)ptA);
    for (ptB._4_4_ = 0; ptB._4_4_ < (int)ptA; ptB._4_4_ = ptB._4_4_ + 1) {
      _i_1 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       (dataPoints,(long)ptB._4_4_);
      fVar5 = tcu::Vector<float,_2>::x(pvStack_68);
      fVar6 = tcu::Vector<float,_2>::x(_i_1);
      fVar5 = de::abs<float>(fVar5 - fVar6);
      if (1e-06 < fVar5) {
        fVar5 = tcu::Vector<float,_2>::y(pvStack_68);
        fVar6 = tcu::Vector<float,_2>::y(_i_1);
        fVar7 = tcu::Vector<float,_2>::x(pvStack_68);
        fVar8 = tcu::Vector<float,_2>::x(_i_1);
        local_7c = (fVar5 - fVar6) / (fVar7 - fVar8);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   &pointwiseOffsets.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_7c);
      }
    }
  }
  bVar2 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)
                     &pointwiseOffsets.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (!bVar2) {
    dataPoints_local._4_4_ =
         destructiveMedian<float>
                   ((vector<float,_std::allocator<float>_> *)
                    &pointwiseOffsets.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  }
  for (local_80 = 0; local_80 < (int)sVar3; local_80 = local_80 + 1) {
    pvVar4 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       (dataPoints,(long)local_80);
    fVar6 = tcu::Vector<float,_2>::y(pvVar4);
    fVar5 = dataPoints_local._4_4_;
    pvVar4 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       (dataPoints,(long)local_80);
    fVar7 = tcu::Vector<float,_2>::x(pvVar4);
    local_84 = fVar6 - fVar5 * fVar7;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_50,&local_84);
  }
  bVar2 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)local_50);
  if (!bVar2) {
    dataPoints_local._0_4_ =
         destructiveMedian<float>((vector<float,_std::allocator<float>_> *)local_50);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_50);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &pointwiseOffsets.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  LVar1.coefficient = dataPoints_local._4_4_;
  LVar1.offset = dataPoints_local._0_4_;
  return LVar1;
}

Assistant:

LineParameters theilSenLinearRegression (const std::vector<tcu::Vec2>& dataPoints)
{
	const float		epsilon					= 1e-6f;

	const int		numDataPoints			= (int)dataPoints.size();
	vector<float>	pairwiseCoefficients;
	vector<float>	pointwiseOffsets;
	LineParameters	result					(0.0f, 0.0f);

	// Compute the pairwise coefficients.
	for (int i = 0; i < numDataPoints; i++)
	{
		const Vec2& ptA = dataPoints[i];

		for (int j = 0; j < i; j++)
		{
			const Vec2& ptB = dataPoints[j];

			if (de::abs(ptA.x() - ptB.x()) > epsilon)
				pairwiseCoefficients.push_back((ptA.y() - ptB.y()) / (ptA.x() - ptB.x()));
		}
	}

	// Find the median of the pairwise coefficients.
	// \note If there are no data point pairs with differing x values, the coefficient variable will stay zero as initialized.
	if (!pairwiseCoefficients.empty())
		result.coefficient = destructiveMedian(pairwiseCoefficients);

	// Compute the offsets corresponding to the median coefficient, for all data points.
	for (int i = 0; i < numDataPoints; i++)
		pointwiseOffsets.push_back(dataPoints[i].y() - result.coefficient*dataPoints[i].x());

	// Find the median of the offsets.
	// \note If there are no data points, the offset variable will stay zero as initialized.
	if (!pointwiseOffsets.empty())
		result.offset = destructiveMedian(pointwiseOffsets);

	return result;
}